

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

value loader_metadata_impl(plugin p,loader_impl impl)

{
  char *__string;
  value v;
  value *ppvVar1;
  size_t length;
  value pvVar2;
  
  __string = plugin_name(p);
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    length = strnlen(__string,0x40);
    pvVar2 = value_create_string(__string,length);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      pvVar2 = loader_impl_metadata(impl);
      ppvVar1[1] = pvVar2;
      if (pvVar2 != (value)0x0) {
        return v;
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value loader_metadata_impl(plugin p, loader_impl impl)
{
	const char *tag = plugin_name(p);

	value *v_ptr, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_ptr = value_to_array(v);

	v_ptr[0] = value_create_string(tag, strnlen(tag, LOADER_TAG_SIZE));

	if (v_ptr[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_ptr[1] = loader_impl_metadata(impl);

	if (v_ptr[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}